

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

void __thiscall CVmObjGramProd::apply_undo(CVmObjGramProd *this,CVmUndoRecord *undo_rec)

{
  int iVar1;
  int *piVar2;
  vmgram_alt_info *alt_00;
  vm_gram_ext *pvVar3;
  undefined4 *in_RSI;
  CVmObjGramProd *in_RDI;
  vmgram_alt_info **alts;
  int idx;
  vmgram_alt_info *alt;
  vm_obj_id_t self;
  vmgram_undo_rec *rec;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar4;
  undefined8 uVar5;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar6;
  
  if (*(long *)(in_RSI + 2) != 0) {
    piVar2 = *(int **)(in_RSI + 2);
    uVar6 = *in_RSI;
    uVar5 = *(undefined8 *)(piVar2 + 2);
    iVar4 = *piVar2;
    pvVar3 = get_ext(in_RDI);
    alt_00 = (vmgram_alt_info *)pvVar3->alts_;
    iVar1 = piVar2[1];
    if (iVar1 == 1) {
      insert_alt((CVmObjGramProd *)CONCAT44(uVar6,in_stack_ffffffffffffffe0),
                 (vm_obj_id_t)((ulong)uVar5 >> 0x20),CONCAT44(iVar4,in_stack_ffffffffffffffd0),
                 alt_00);
      piVar2[2] = 0;
      piVar2[3] = 0;
    }
    else if (iVar1 == 2) {
      *(undefined8 *)(&alt_00->score + (long)iVar4 * 2) = uVar5;
    }
    else if (iVar1 == 3) {
      delete_alt((CVmObjGramProd *)CONCAT44(iVar4,in_stack_ffffffffffffffd0),(size_t)alt_00);
      check_circular_refs((CVmObjGramProd *)CONCAT44(uVar6,in_stack_ffffffffffffffe0),
                          (vm_obj_id_t)((ulong)uVar5 >> 0x20));
    }
  }
  return;
}

Assistant:

void CVmObjGramProd::apply_undo(VMG_ CVmUndoRecord *undo_rec)
{
    /* we only store pointer records, so ignore other types */
    if (undo_rec->id.ptrval != 0)
    {
        /* get our private undo record, properly cast */
        vmgram_undo_rec *rec = (vmgram_undo_rec *)undo_rec->id.ptrval;

        /* get the 'self' object from the undo record */
        vm_obj_id_t self = undo_rec->obj;

        /* get the original alternative object and its original index */
        vmgram_alt_info *alt = rec->alt;
        int idx = rec->idx;

        /* get our alternative list and count */
        vmgram_alt_info **alts = get_ext()->alts_;
        
        /* apply undo based on the event type */
        switch (rec->op)
        {
        case VMGRAM_UNDO_DELETED:
            /* deleted a record - re-insert it at the original index */
            insert_alt(self, idx, alt);

            /* the grammar prod object owns it now - clear it in the undo */
            rec->alt = 0;
            break;

        case VMGRAM_UNDO_REPLACED:
            /* replaced a record - restore it at the original index */
            alts[idx] = alt;
            break;

        case VMGRAM_UNDO_ADDED:
            /* added a new record - delete the record at this index */
            delete_alt(idx);

            /* check for circular references */
            check_circular_refs(self);
            break;
        }
    }
}